

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::CheckProperty(cmTarget *this,string *prop,cmMakefile *context)

{
  bool bVar1;
  char *value_00;
  char *value_2;
  char *local_80;
  char *value_1;
  char *local_58;
  char *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  cmMakefile *local_20;
  cmMakefile *context_local;
  string *prop_local;
  cmTarget *this_local;
  
  local_20 = context;
  context_local = (cmMakefile *)prop;
  prop_local = (string *)this;
  std::__cxx11::string::string((string *)&local_40,(string *)prop);
  bVar1 = cmHasLiteralPrefix<std::__cxx11::string,25ul>(&local_40,(char (*) [25])0x8e1525);
  std::__cxx11::string::~string((string *)&local_40);
  if ((bVar1) && (local_58 = GetProperty(this,(string *)context_local), local_58 != (char *)0x0)) {
    cmTargetCheckLINK_INTERFACE_LIBRARIES((string *)context_local,local_58,local_20,false);
  }
  std::__cxx11::string::string((string *)&value_1,(string *)context_local);
  bVar1 = cmHasLiteralPrefix<std::__cxx11::string,34ul>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_1,
                     (char (*) [34])"IMPORTED_LINK_INTERFACE_LIBRARIES");
  std::__cxx11::string::~string((string *)&value_1);
  if ((bVar1) && (local_80 = GetProperty(this,(string *)context_local), local_80 != (char *)0x0)) {
    cmTargetCheckLINK_INTERFACE_LIBRARIES((string *)context_local,local_80,local_20,true);
  }
  std::__cxx11::string::string((string *)&value_2,(string *)context_local);
  bVar1 = cmHasLiteralPrefix<std::__cxx11::string,25ul>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_2,
                     (char (*) [25])"INTERFACE_LINK_LIBRARIES");
  std::__cxx11::string::~string((string *)&value_2);
  if ((bVar1) && (value_00 = GetProperty(this,(string *)context_local), value_00 != (char *)0x0)) {
    cmTargetCheckINTERFACE_LINK_LIBRARIES(value_00,local_20);
  }
  return;
}

Assistant:

void cmTarget::CheckProperty(const std::string& prop,
                             cmMakefile* context) const
{
  // Certain properties need checking.
  if(cmHasLiteralPrefix(prop, "LINK_INTERFACE_LIBRARIES"))
    {
    if(const char* value = this->GetProperty(prop))
      {
      cmTargetCheckLINK_INTERFACE_LIBRARIES(prop, value, context, false);
      }
    }
  if(cmHasLiteralPrefix(prop, "IMPORTED_LINK_INTERFACE_LIBRARIES"))
    {
    if(const char* value = this->GetProperty(prop))
      {
      cmTargetCheckLINK_INTERFACE_LIBRARIES(prop, value, context, true);
      }
    }
  if(cmHasLiteralPrefix(prop, "INTERFACE_LINK_LIBRARIES"))
    {
    if(const char* value = this->GetProperty(prop))
      {
      cmTargetCheckINTERFACE_LINK_LIBRARIES(value, context);
      }
    }
}